

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O3

bool google::protobuf::compiler::objectivec::anon_unknown_0::IsSpecialName
               (string *name,string *special_names,size_t count)

{
  string *psVar1;
  int iVar2;
  
  if (count == 0) {
    return false;
  }
  do {
    psVar1 = (string *)special_names->_M_string_length;
    iVar2 = std::__cxx11::string::compare((ulong)name,0,psVar1);
    if (iVar2 == 0) {
      if ((string *)name->_M_string_length <= psVar1) {
        return true;
      }
      return (byte)((char)psVar1[(long)(name->_M_dataplus)._M_p] + 0x85U) < 0xe6;
    }
    special_names = special_names + 1;
    count = count - 1;
  } while (count != 0);
  return false;
}

Assistant:

bool IsSpecialName(const std::string& name, const std::string* special_names,
                   size_t count) {
  for (size_t i = 0; i < count; ++i) {
    size_t length = special_names[i].length();
    if (name.compare(0, length, special_names[i]) == 0) {
      if (name.length() > length) {
        // If name is longer than the retained_name[i] that it matches
        // the next character must be not lower case (newton vs newTon vs
        // new_ton).
        return !ascii_islower(name[length]);
      } else {
        return true;
      }
    }
  }
  return false;
}